

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

StatementBlockSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::StatementBlockSymbol,slang::ast::Compilation&,char_const(&)[1],slang::SourceLocation&,slang::ast::StatementBlockKind,slang::ast::VariableLifetime>
          (BumpAllocator *this,Compilation *args,char (*args_1) [1],SourceLocation *args_2,
          StatementBlockKind *args_3,VariableLifetime *args_4)

{
  StatementBlockKind SVar1;
  VariableLifetime VVar2;
  SourceLocation SVar3;
  size_t sVar4;
  StatementBlockSymbol *thisSym_;
  
  thisSym_ = (StatementBlockSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((StatementBlockSymbol *)this->endPtr < thisSym_ + 1) {
    thisSym_ = (StatementBlockSymbol *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(thisSym_ + 1);
  }
  sVar4 = strlen(*args_1);
  SVar3 = *args_2;
  SVar1 = *args_3;
  VVar2 = *args_4;
  (thisSym_->super_Symbol).kind = StatementBlock;
  (thisSym_->super_Symbol).name._M_len = sVar4;
  (thisSym_->super_Symbol).name._M_str = *args_1;
  (thisSym_->super_Symbol).location = SVar3;
  (thisSym_->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (thisSym_->super_Symbol).parentScope = (Scope *)0x0;
  (thisSym_->super_Symbol).nextInScope = (Symbol *)0x0;
  (thisSym_->super_Symbol).indexInScope = 0;
  ast::Scope::Scope(&thisSym_->super_Scope,args,&thisSym_->super_Symbol);
  thisSym_->blockKind = SVar1;
  thisSym_->defaultLifetime = VVar2;
  (thisSym_->blocks)._M_ptr = (pointer)0x0;
  (thisSym_->blocks)._M_extent._M_extent_value = 0;
  thisSym_->stmt = (Statement *)0x0;
  return thisSym_;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }